

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<unsigned_long> * __thiscall
kj::_::ExceptionOr<unsigned_long>::operator=
          (ExceptionOr<unsigned_long> *this,ExceptionOr<unsigned_long> *param_1)

{
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1 = (param_1->value).ptr.field_1;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;